

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal_cost.cpp
# Opt level: O0

void EstimateBitCostsForLiteralsUTF8
               (size_t pos,size_t len,size_t mask,uint8_t *data,size_t *histogram,float *cost)

{
  double dVar1;
  ulong c_00;
  size_t sVar2;
  long in_RCX;
  long lVar3;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  void *in_R8;
  long in_R9;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double lit_cost;
  size_t histo;
  size_t masked_pos;
  size_t utf8_pos_1;
  size_t last_c_3;
  size_t c_3;
  size_t utf8_pos2_1;
  size_t last_c_2;
  size_t c_2;
  size_t utf8_pos2;
  size_t last_c_1;
  size_t c_1;
  size_t c;
  size_t utf8_pos;
  size_t last_c;
  size_t i;
  size_t in_window_utf8 [3];
  size_t in_window;
  size_t window_half;
  size_t max_utf8;
  uint local_130;
  uint local_12c;
  uint local_128;
  uint local_124;
  ulong local_120;
  double local_118;
  ulong local_110;
  uint8_t *in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  size_t local_b0;
  size_t local_a8;
  ulong local_a0;
  ulong local_98 [4];
  ulong local_78;
  ulong local_70;
  size_t local_68;
  long local_60;
  void *local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  ulong local_30;
  undefined8 local_28;
  ulong local_20;
  double local_18;
  ulong local_10;
  double local_8;
  
  local_60 = in_R9;
  local_58 = in_R8;
  local_50 = in_RCX;
  local_48 = in_RDX;
  local_40 = in_RSI;
  local_38 = in_RDI;
  local_68 = DecideMultiByteStatsLevel
                       (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                        in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  local_70 = 0x1ef;
  local_28 = 0x1ef;
  local_30 = local_40;
  if (local_40 < 0x1f0) {
    local_120 = local_40;
  }
  else {
    local_120 = 0x1ef;
  }
  local_78 = local_120;
  memset(local_98,0,0x18);
  memset(local_58,0,0x1800);
  local_a8 = 0;
  local_b0 = 0;
  for (local_a0 = 0; local_a0 < local_78; local_a0 = local_a0 + 1) {
    c_00 = (ulong)*(byte *)(local_50 + (local_38 + local_a0 & local_48));
    lVar3 = local_b0 * 0x100 + c_00;
    *(long *)((long)local_58 + lVar3 * 8) = *(long *)((long)local_58 + lVar3 * 8) + 1;
    local_98[local_b0] = local_98[local_b0] + 1;
    local_b0 = UTF8Position(local_a8,c_00,local_68);
    local_a8 = c_00;
  }
  for (local_a0 = 0; local_a0 < local_40; local_a0 = local_a0 + 1) {
    if (local_70 <= local_a0) {
      if (local_a0 < local_70 + 1) {
        local_124 = 0;
      }
      else {
        local_124 = (uint)*(byte *)(local_50 + (((local_38 + local_a0) - local_70) - 1 & local_48));
      }
      if (local_a0 < local_70 + 2) {
        local_128 = 0;
      }
      else {
        local_128 = (uint)*(byte *)(local_50 + (((local_38 + local_a0) - local_70) - 2 & local_48));
      }
      sVar2 = UTF8Position((long)(int)local_128,(long)(int)local_124,local_68);
      lVar3 = sVar2 * 0x100 +
              (ulong)*(byte *)(local_50 + ((local_38 + local_a0) - local_70 & local_48));
      *(long *)((long)local_58 + lVar3 * 8) = *(long *)((long)local_58 + lVar3 * 8) + -1;
      local_98[sVar2] = local_98[sVar2] - 1;
    }
    if (local_a0 + local_70 < local_40) {
      sVar2 = UTF8Position((ulong)*(byte *)(local_50 +
                                           ((local_38 + local_a0 + local_70) - 2 & local_48)),
                           (ulong)*(byte *)(local_50 +
                                           ((local_38 + local_a0 + local_70) - 1 & local_48)),
                           local_68);
      lVar3 = sVar2 * 0x100 +
              (ulong)*(byte *)(local_50 + (local_38 + local_a0 + local_70 & local_48));
      *(long *)((long)local_58 + lVar3 * 8) = *(long *)((long)local_58 + lVar3 * 8) + 1;
      local_98[sVar2] = local_98[sVar2] + 1;
    }
    if (local_a0 == 0) {
      local_12c = 0;
    }
    else {
      local_12c = (uint)*(byte *)(local_50 + ((local_38 + local_a0) - 1 & local_48));
    }
    if (local_a0 < 2) {
      local_130 = 0;
    }
    else {
      local_130 = (uint)*(byte *)(local_50 + ((local_38 + local_a0) - 2 & local_48));
    }
    sVar2 = UTF8Position((long)(int)local_130,(long)(int)local_12c,local_68);
    local_110 = *(ulong *)((long)local_58 +
                          (sVar2 * 0x100 +
                          (ulong)*(byte *)(local_50 + (local_38 + local_a0 & local_48))) * 8);
    if (local_110 == 0) {
      local_110 = 1;
    }
    local_10 = local_98[sVar2];
    if (local_10 < 0x100) {
      local_8 = *(double *)(duckdb_brotli::kBrotliLog2Table + local_10 * 8);
    }
    else {
      auVar4._8_4_ = (int)(local_10 >> 0x20);
      auVar4._0_8_ = local_10;
      auVar4._12_4_ = 0x45300000;
      local_8 = log2((auVar4._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_10) - 4503599627370496.0));
    }
    dVar1 = local_8;
    local_20 = local_110;
    if (local_110 < 0x100) {
      local_18 = *(double *)(duckdb_brotli::kBrotliLog2Table + local_110 * 8);
    }
    else {
      auVar5._8_4_ = (int)(local_110 >> 0x20);
      auVar5._0_8_ = local_110;
      auVar5._12_4_ = 0x45300000;
      local_18 = log2((auVar5._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)local_110) - 4503599627370496.0));
    }
    local_118 = (dVar1 - local_18) + 0.02905;
    if (local_118 < 1.0) {
      local_118 = local_118 * 0.5 + 0.5;
    }
    if (local_a0 < 2000) {
      lVar3 = 2000 - local_a0;
      auVar6._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar6._0_8_ = lVar3;
      auVar6._12_4_ = 0x45300000;
      local_118 = -(((auVar6._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) / 2000.0) * 0.35
                  + 0.7 + local_118;
    }
    *(float *)(local_60 + local_a0 * 4) = (float)local_118;
  }
  return;
}

Assistant:

static void EstimateBitCostsForLiteralsUTF8(size_t pos, size_t len, size_t mask,
                                            const uint8_t* data,
                                            size_t* histogram, float* cost) {
  /* max_utf8 is 0 (normal ASCII single byte modeling),
     1 (for 2-byte UTF-8 modeling), or 2 (for 3-byte UTF-8 modeling). */
  const size_t max_utf8 = DecideMultiByteStatsLevel(pos, len, mask, data);
  size_t window_half = 495;
  size_t in_window = BROTLI_MIN(size_t, window_half, len);
  size_t in_window_utf8[3] = { 0 };
  size_t i;
  memset(histogram, 0, 3 * 256 * sizeof(histogram[0]));

  {  /* Bootstrap histograms. */
    size_t last_c = 0;
    size_t utf8_pos = 0;
    for (i = 0; i < in_window; ++i) {
      size_t c = data[(pos + i) & mask];
      ++histogram[256 * utf8_pos + c];
      ++in_window_utf8[utf8_pos];
      utf8_pos = UTF8Position(last_c, c, max_utf8);
      last_c = c;
    }
  }

  /* Compute bit costs with sliding window. */
  for (i = 0; i < len; ++i) {
    if (i >= window_half) {
      /* Remove a byte in the past. */
      size_t c =
          i < window_half + 1 ? 0 : data[(pos + i - window_half - 1) & mask];
      size_t last_c =
          i < window_half + 2 ? 0 : data[(pos + i - window_half - 2) & mask];
      size_t utf8_pos2 = UTF8Position(last_c, c, max_utf8);
      --histogram[256 * utf8_pos2 + data[(pos + i - window_half) & mask]];
      --in_window_utf8[utf8_pos2];
    }
    if (i + window_half < len) {
      /* Add a byte in the future. */
      size_t c = data[(pos + i + window_half - 1) & mask];
      size_t last_c = data[(pos + i + window_half - 2) & mask];
      size_t utf8_pos2 = UTF8Position(last_c, c, max_utf8);
      ++histogram[256 * utf8_pos2 + data[(pos + i + window_half) & mask]];
      ++in_window_utf8[utf8_pos2];
    }
    {
      size_t c = i < 1 ? 0 : data[(pos + i - 1) & mask];
      size_t last_c = i < 2 ? 0 : data[(pos + i - 2) & mask];
      size_t utf8_pos = UTF8Position(last_c, c, max_utf8);
      size_t masked_pos = (pos + i) & mask;
      size_t histo = histogram[256 * utf8_pos + data[masked_pos]];
      double lit_cost;
      if (histo == 0) {
        histo = 1;
      }
      lit_cost = FastLog2(in_window_utf8[utf8_pos]) - FastLog2(histo);
      lit_cost += 0.02905;
      if (lit_cost < 1.0) {
        lit_cost *= 0.5;
        lit_cost += 0.5;
      }
      /* Make the first bytes more expensive -- seems to help, not sure why.
         Perhaps because the entropy source is changing its properties
         rapidly in the beginning of the file, perhaps because the beginning
         of the data is a statistical "anomaly". */
      if (i < 2000) {
        lit_cost += 0.7 - ((double)(2000 - i) / 2000.0 * 0.35);
      }
      cost[i] = (float)lit_cost;
    }
  }
}